

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ugui_sdl_t *sdl_ctx_00;
  uint8_t *data;
  uint8_t *img;
  int event;
  ugui_sdl_t *sdl_ctx;
  char **argv_local;
  int argc_local;
  
  printf("\r\n------------------------------------\r\n");
  printf("micro-gui (ugui) example application\r\n");
  printf("Output will appear in an SDL window and real time in ./test.bmp\r\n");
  printf("Use arrow keys for directional navigation\r\n");
  sdl_ctx_00 = ugui_sdl_init("micro-gui example",0x280,0x1e0);
  gui = ugui_create(0x280,0x1e0);
  running = 1;
  menu_test_window = menu_window_create(0x280,0x1e0);
  ugui_window_stack_push(gui,menu_test_window);
  ugui_render(gui);
  while ((0 < running && (iVar1 = ugui_sdl_get_event(sdl_ctx_00), iVar1 != 7))) {
    ugui_put_event(gui,(uint8_t)iVar1);
    ugui_render(gui);
    data = ugui_get_image(gui);
    bmp_create_bw("test.bmp",0x280,0x1e0,data);
    ugui_sdl_render_bmp(sdl_ctx_00,"test.bmp");
    usleep(1000);
  }
  ugui_destroy(gui);
  ugui_sdl_close(sdl_ctx_00);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{

#ifdef USE_SDL2
	printf("\r\n------------------------------------\r\n");
	printf("micro-gui (ugui) example application\r\n");
	printf("Output will appear in an SDL window and real time in ./test.bmp\r\n");
	printf("Use arrow keys for directional navigation\r\n");

#else
printf("\r\n------------------------------------\r\n");
	printf("micro-gui (ugui) example application\r\n");
	printf("Output will appear (while running) in ./test.bmp\r\n");
	printf("You may need to refresh this image manually.\r\n");
	printf("Alternately, compile without -DNO_SDL2 to enable SDL2 based rendering\r\n");
	printf("Use wasd to for directional navigation, q for back, and e for select\r\n");
	printf("Note that you will need to press enter following each command\r\n");
#endif

#ifdef USE_SDL2
	ugui_sdl_t *sdl_ctx = ugui_sdl_init("micro-gui example", GUI_WIDTH, GUI_HEIGHT);
#endif

	gui = ugui_create(GUI_WIDTH, GUI_HEIGHT);
	running = 1;

	menu_test_window = menu_window_create(GUI_WIDTH, GUI_HEIGHT);
	//ugui_window_set_event_handler(menu_test_window, handle_event, NULL);
#if 0

#endif
	ugui_window_stack_push(gui, menu_test_window);

	ugui_render(gui);

	while (running > 0) {

		//Process input events
#ifdef USE_SDL2
		int event = ugui_sdl_get_event(sdl_ctx);
#else
		int event = get_input_event();
#endif
		if (event == UGUI_EVT_EXIT) {
			break;
		}

		ugui_put_event(gui, event);

		ugui_render(gui);

		uint8_t *img = ugui_get_image(gui);

		bmp_create_bw("test.bmp", GUI_WIDTH, GUI_HEIGHT, img);

#ifdef USE_SDL2
		ugui_sdl_render_bmp(sdl_ctx, "test.bmp");
#endif

		usleep(1000);
	}

	ugui_destroy(gui);

#ifdef USE_SDL2
	ugui_sdl_close(sdl_ctx);
#endif

	return 0;
}